

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyDialogue(TidyDocImpl *doc,uint code,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  TidyReportLevel local_44;
  TidyMessageImpl *pTStack_40;
  TidyReportLevel level;
  TidyMessageImpl *message;
  va_list args;
  int local_18;
  int i;
  uint code_local;
  TidyDocImpl *doc_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_18 = 0;
  while( true ) {
    if (*(int *)((long)local_18 * 8 + 0x1ff000) == 0) {
      return;
    }
    if (*(uint *)((long)local_18 * 8 + 0x1ff000) == code) break;
    local_18 = local_18 + 1;
  }
  local_44 = dialogueDispatchTable[local_18].level;
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  message._4_4_ = 0x30;
  message._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  pTStack_40 = formatDialogue(doc,code,local_44,(__va_list_tag *)&message);
  messageOut(pTStack_40);
  return;
}

Assistant:

void TY_(Dialogue)(TidyDocImpl* doc, uint code, ...)
{
    int i = 0;
    va_list args;

    while ( dialogueDispatchTable[i].code != 0 )
    {
        if ( dialogueDispatchTable[i].code == code )
        {
            TidyMessageImpl *message;
            TidyReportLevel level = dialogueDispatchTable[i].level;
            va_start(args, code);
            message = formatDialogue( doc, code, level, args );
            va_end(args);
            messageOut( message );
            break;
        }
        i++;
    }
}